

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O3

PatternClip * __thiscall PatternClip::operator=(PatternClip *this,PatternClip *clip)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  _Head_base<0UL,_char_*,_false> _Var2;
  undefined8 uVar3;
  int iVar4;
  PatternSelection local_28;
  
  _Var1._M_head_impl =
       (clip->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (clip->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  _Var2._M_head_impl =
       (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (char *)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  iVar4 = (clip->mLocation).mEnd.super_PatternCursorBase.track;
  (this->mLocation).mEnd.super_PatternCursorBase.column =
       (clip->mLocation).mEnd.super_PatternCursorBase.column;
  (this->mLocation).mEnd.super_PatternCursorBase.track = iVar4;
  iVar4 = (clip->mLocation).mStart.super_PatternCursorBase.column;
  uVar3 = *(undefined8 *)&(clip->mLocation).mStart.super_PatternCursorBase.track;
  (this->mLocation).mStart.super_PatternCursorBase.row =
       (clip->mLocation).mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column = iVar4;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = uVar3;
  PatternSelection::PatternSelection(&local_28);
  (clip->mLocation).mEnd.super_PatternCursorBase.column =
       local_28.mEnd.super_PatternCursorBase.column;
  (clip->mLocation).mEnd.super_PatternCursorBase.track = local_28.mEnd.super_PatternCursorBase.track
  ;
  (clip->mLocation).mStart.super_PatternCursorBase.row = local_28.mStart.super_PatternCursorBase.row
  ;
  (clip->mLocation).mStart.super_PatternCursorBase.column =
       local_28.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(clip->mLocation).mStart.super_PatternCursorBase.track = local_28._8_8_;
  return this;
}

Assistant:

PatternClip& PatternClip::operator=(PatternClip &&clip) noexcept {
    // move the clips data to ours, resetting the clip's data
    mData = std::exchange(clip.mData, nullptr);
    mLocation = clip.mLocation;
    clip.mLocation = {};
    return *this;
}